

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>_>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>_> *this,
           void *pointer)

{
  long lVar1;
  size_t in_RCX;
  int fd;
  StringPtr path;
  
  if (pointer != (void *)0x0) {
    if (*(char *)((long)pointer + 0x58) == '\0') {
      lVar1 = *(long *)((long)pointer + 0x30);
      if (lVar1 == 0) {
        fd = 0x20b013;
      }
      else {
        fd = (int)*(undefined8 *)((long)pointer + 0x28);
      }
      path.content.ptr = (char *)(lVar1 + (ulong)(lVar1 == 0));
      path.content.size_ = in_RCX;
      anon_unknown_9::rmrf((anon_unknown_9 *)(ulong)**(uint **)((long)pointer + 0x20),fd,path);
    }
    Array<char>::~Array((Array<char> *)((long)pointer + 0x40));
    Array<char>::~Array((Array<char> *)((long)pointer + 0x28));
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x60);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }